

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demux.c
# Opt level: O1

ParseStatus StoreFrame(int frame_num,uint32_t min_size,MemBuffer_conflict *mem,Frame *frame)

{
  size_t sVar1;
  size_t data_size;
  byte bVar2;
  int iVar3;
  uint8_t *puVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  VP8StatusCode VVar9;
  ulong uVar10;
  size_t sVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  ParseStatus unaff_R13D;
  ParseStatus PVar15;
  ParseStatus PVar16;
  WebPBitstreamFeatures features;
  WebPBitstreamFeatures local_58;
  
  uVar10 = mem->end - mem->start;
  bVar8 = uVar10 < min_size || uVar10 < 8;
  PVar16 = PARSE_NEED_MORE_DATA;
  if (uVar10 >= min_size && uVar10 >= 8) {
    PVar15 = PARSE_OK;
    bVar6 = false;
    bVar7 = false;
    do {
      sVar11 = mem->start;
      puVar4 = mem->buf;
      iVar3 = *(int *)(puVar4 + sVar11);
      mem->start = sVar11 + 4;
      bVar2 = puVar4[sVar11 + 4];
      uVar12 = (uint)puVar4[sVar11 + 6] << 0x10 | (uint)puVar4[sVar11 + 5] << 8 |
               (uint)puVar4[sVar11 + 7] << 0x18 | (uint)bVar2;
      sVar1 = sVar11 + 8;
      mem->start = sVar1;
      if (uVar12 < 0xfffffff7) {
        uVar13 = (ulong)(uVar12 + (bVar2 & 1));
        uVar14 = mem->end - sVar1;
        uVar10 = uVar13;
        if (uVar14 < uVar13) {
          uVar10 = uVar14;
        }
        if (mem->riff_end - sVar1 < uVar13) goto LAB_001509e6;
        data_size = uVar10 + 8;
        if (uVar14 < uVar13) {
          PVar15 = PARSE_NEED_MORE_DATA;
        }
        if (iVar3 == 0x20385056) {
LAB_00150a76:
          if (bVar6) {
LAB_00150a7a:
            bVar8 = true;
            goto LAB_00150a80;
          }
          VVar9 = WebPGetFeaturesInternal(puVar4 + sVar11,data_size,&local_58,0x210);
          if ((PVar15 == PARSE_NEED_MORE_DATA) && (VVar9 == VP8_STATUS_NOT_ENOUGH_DATA)) {
            bVar5 = false;
            unaff_R13D = PARSE_NEED_MORE_DATA;
            bVar6 = false;
          }
          else if (VVar9 == VP8_STATUS_OK) {
            frame->img_components[0].offset = sVar11;
            frame->img_components[0].size = data_size;
            frame->width = local_58.width;
            frame->height = local_58.height;
            frame->has_alpha = frame->has_alpha | local_58.has_alpha;
            frame->frame_num = frame_num;
            frame->complete = (uint)(PVar15 == PARSE_OK);
            mem->start = mem->start + uVar10;
            bVar6 = true;
            bVar5 = true;
          }
          else {
            unaff_R13D = PARSE_ERROR;
            bVar5 = false;
            bVar6 = false;
          }
          if (bVar5) goto LAB_00150a88;
          bVar5 = false;
        }
        else {
          if (iVar3 == 0x4c385056) {
            if (bVar7) {
              bVar7 = true;
              goto LAB_001509e6;
            }
            goto LAB_00150a76;
          }
          if ((iVar3 != 0x48504c41) || (bVar7)) goto LAB_00150a7a;
          frame->img_components[1].offset = sVar11;
          frame->img_components[1].size = data_size;
          frame->has_alpha = 1;
          frame->frame_num = frame_num;
          sVar11 = uVar10 + sVar1;
          bVar7 = true;
LAB_00150a80:
          mem->start = sVar11;
LAB_00150a88:
          bVar5 = true;
          if (mem->start == mem->riff_end) {
            bVar8 = true;
          }
          else if (mem->end - mem->start < 8) {
            PVar15 = PARSE_NEED_MORE_DATA;
          }
        }
      }
      else {
LAB_001509e6:
        bVar5 = false;
        unaff_R13D = PARSE_ERROR;
      }
      PVar16 = unaff_R13D;
    } while ((bVar5) && (PVar16 = PVar15, !bVar8 && PVar15 == PARSE_OK));
  }
  return PVar16;
}

Assistant:

static ParseStatus StoreFrame(int frame_num, uint32_t min_size,
                              MemBuffer* const mem, Frame* const frame) {
  int alpha_chunks = 0;
  int image_chunks = 0;
  int done = (MemDataSize(mem) < CHUNK_HEADER_SIZE ||
              MemDataSize(mem) < min_size);
  ParseStatus status = PARSE_OK;

  if (done) return PARSE_NEED_MORE_DATA;

  do {
    const size_t chunk_start_offset = mem->start;
    const uint32_t fourcc = ReadLE32(mem);
    const uint32_t payload_size = ReadLE32(mem);
    uint32_t payload_size_padded;
    size_t payload_available;
    size_t chunk_size;

    if (payload_size > MAX_CHUNK_PAYLOAD) return PARSE_ERROR;

    payload_size_padded = payload_size + (payload_size & 1);
    payload_available = (payload_size_padded > MemDataSize(mem))
                      ? MemDataSize(mem) : payload_size_padded;
    chunk_size = CHUNK_HEADER_SIZE + payload_available;
    if (SizeIsInvalid(mem, payload_size_padded)) return PARSE_ERROR;
    if (payload_size_padded > MemDataSize(mem)) status = PARSE_NEED_MORE_DATA;

    switch (fourcc) {
      case MKFOURCC('A', 'L', 'P', 'H'):
        if (alpha_chunks == 0) {
          ++alpha_chunks;
          frame->img_components[1].offset = chunk_start_offset;
          frame->img_components[1].size = chunk_size;
          frame->has_alpha = 1;
          frame->frame_num = frame_num;
          Skip(mem, payload_available);
        } else {
          goto Done;
        }
        break;
      case MKFOURCC('V', 'P', '8', 'L'):
        if (alpha_chunks > 0) return PARSE_ERROR;  // VP8L has its own alpha
        // fall through
      case MKFOURCC('V', 'P', '8', ' '):
        if (image_chunks == 0) {
          // Extract the bitstream features, tolerating failures when the data
          // is incomplete.
          WebPBitstreamFeatures features;
          const VP8StatusCode vp8_status =
              WebPGetFeatures(mem->buf + chunk_start_offset, chunk_size,
                              &features);
          if (status == PARSE_NEED_MORE_DATA &&
              vp8_status == VP8_STATUS_NOT_ENOUGH_DATA) {
            return PARSE_NEED_MORE_DATA;
          } else if (vp8_status != VP8_STATUS_OK) {
            // We have enough data, and yet WebPGetFeatures() failed.
            return PARSE_ERROR;
          }
          ++image_chunks;
          SetFrameInfo(chunk_start_offset, chunk_size, frame_num,
                       status == PARSE_OK, &features, frame);
          Skip(mem, payload_available);
        } else {
          goto Done;
        }
        break;
 Done:
      default:
        // Restore fourcc/size when moving up one level in parsing.
        Rewind(mem, CHUNK_HEADER_SIZE);
        done = 1;
        break;
    }

    if (mem->start == mem->riff_end) {
      done = 1;
    } else if (MemDataSize(mem) < CHUNK_HEADER_SIZE) {
      status = PARSE_NEED_MORE_DATA;
    }
  } while (!done && status == PARSE_OK);

  return status;
}